

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status __thiscall
ghc::filesystem::detail::file_status_from_st_mode<unsigned_int>(detail *this,uint mode)

{
  undefined4 local_18;
  perms prms;
  file_type ft;
  uint mode_local;
  
  local_18 = unknown;
  if ((mode & 0xf000) == 0x4000) {
    local_18 = directory;
  }
  else if ((mode & 0xf000) == 0x8000) {
    local_18 = regular;
  }
  else if ((mode & 0xf000) == 0x2000) {
    local_18 = character;
  }
  else if ((mode & 0xf000) == 0x6000) {
    local_18 = block;
  }
  else if ((mode & 0xf000) == 0x1000) {
    local_18 = fifo;
  }
  else if ((mode & 0xf000) == 0xa000) {
    local_18 = symlink;
  }
  else if ((mode & 0xf000) == 0xc000) {
    local_18 = socket;
  }
  file_status::file_status((file_status *)this,local_18,(perms)mode & mask);
  return (file_status)this;
}

Assistant:

GHC_INLINE file_status file_status_from_st_mode(T mode)
{
#ifdef GHC_OS_WINDOWS
    file_type ft = file_type::unknown;
    if ((mode & _S_IFDIR) == _S_IFDIR) {
        ft = file_type::directory;
    }
    else if ((mode & _S_IFREG) == _S_IFREG) {
        ft = file_type::regular;
    }
    else if ((mode & _S_IFCHR) == _S_IFCHR) {
        ft = file_type::character;
    }
    perms prms = static_cast<perms>(mode & 0xfff);
    return file_status(ft, prms);
#else
    file_type ft = file_type::unknown;
    if (S_ISDIR(mode)) {
        ft = file_type::directory;
    }
    else if (S_ISREG(mode)) {
        ft = file_type::regular;
    }
    else if (S_ISCHR(mode)) {
        ft = file_type::character;
    }
    else if (S_ISBLK(mode)) {
        ft = file_type::block;
    }
    else if (S_ISFIFO(mode)) {
        ft = file_type::fifo;
    }
    else if (S_ISLNK(mode)) {
        ft = file_type::symlink;
    }
    else if (S_ISSOCK(mode)) {
        ft = file_type::socket;
    }
    perms prms = static_cast<perms>(mode & 0xfff);
    return file_status(ft, prms);
#endif
}